

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::HasLineBreak(FunctionBody *this,charcount_t start,charcount_t end)

{
  uint uVar1;
  char16 cVar2;
  LPCUTF8 pch;
  ulong uVar3;
  int iVar4;
  uint cchIndex;
  bool bVar5;
  LPCUTF8 local_40;
  DecodeOptions local_34 [2];
  DecodeOptions options;
  
  iVar4 = start - end;
  if (((start < end || iVar4 == 0) &&
      ((this->super_ParseableFunctionInfo).m_cchStartOffset <= start)) &&
     (end - start <= (this->super_ParseableFunctionInfo).m_cchLength)) {
    pch = ParseableFunctionInfo::GetSource
                    (&this->super_ParseableFunctionInfo,L"FunctionBody::HasLineBreak");
    uVar1 = (this->super_ParseableFunctionInfo).m_cbLength;
    cchIndex = start - (this->super_ParseableFunctionInfo).m_cchStartOffset;
    if (uVar1 == (this->super_ParseableFunctionInfo).m_cchLength) {
      uVar3 = (ulong)cchIndex;
    }
    else {
      uVar3 = utf8::CharacterIndexToByteIndex(pch,(ulong)uVar1,cchIndex,doAllowThreeByteSurrogates);
    }
    local_40 = pch + uVar3;
    local_34[0] = doAllowThreeByteSurrogates;
    for (; bVar5 = iVar4 != 0, bVar5; iVar4 = iVar4 + 1) {
      cVar2 = utf8::Decode(&local_40,pch + uVar1,local_34,(bool *)0x0);
      if ((ushort)cVar2 - 0x2028 < 2) {
        return bVar5;
      }
      if (cVar2 == L'\n') {
        return bVar5;
      }
      if (cVar2 == L'\r') {
        return bVar5;
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool FunctionBody::HasLineBreak(charcount_t start, charcount_t end) const
    {
        if (start > end) return false;
        charcount_t cchLength = end - start;
        if (start < this->m_cchStartOffset || cchLength > this->m_cchLength) return false;
        LPCUTF8 src = this->GetSource(_u("FunctionBody::HasLineBreak"));
        LPCUTF8 last = src + this->LengthInBytes();
        size_t offset = this->LengthInBytes() == this->m_cchLength ?
            start - this->m_cchStartOffset :
            utf8::CharacterIndexToByteIndex(src, this->LengthInBytes(), start - this->m_cchStartOffset, utf8::doAllowThreeByteSurrogates);
        src = src + offset;

        utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

        for (charcount_t cch = cchLength; cch > 0; --cch)
        {
            switch (utf8::Decode(src, last, options))
            {
            case '\r':
            case '\n':
            case 0x2028:
            case 0x2029:
                return true;
            }
        }

        return false;
    }